

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

R_conflict17 millisToWithinRange(qint64 millis)

{
  int year;
  long lVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  optional<long_long> oVar5;
  R_conflict17 RVar6;
  YearMonthDay YVar7;
  
  if (millis < 0) {
    uVar3 = (millis + 1) / 86400000 - 1;
  }
  else {
    uVar3 = (ulong)millis / 86400000;
  }
  YVar7 = QGregorianCalendar::partsFromJulian(uVar3 + 0x253d8c);
  year = systemTimeYearMatching(YVar7.year);
  oVar5 = QGregorianCalendar::julianFromParts(year,YVar7.month,YVar7.day);
  if (((undefined1  [16])
       oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
       super__Optional_payload_base<long_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    lVar2 = 0;
    uVar3 = 0;
  }
  else {
    lVar1 = oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
            super__Optional_payload_base<long_long>._M_payload - (uVar3 + 0x253d8c);
    bVar4 = SEXT816(lVar1 * 86400000) != SEXT816(lVar1) * SEXT416(86400000);
    lVar2 = lVar1 * 86400000;
    if (!bVar4) {
      lVar2 = lVar1 * 86400000 + millis;
    }
    uVar3 = CONCAT71(oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
                     super__Optional_payload_base<long_long>._9_7_,
                     bVar4 || SCARRY8(lVar1 * 86400000,millis)) ^ 1;
  }
  RVar6._8_8_ = uVar3;
  RVar6.shifted = lVar2;
  return RVar6;
}

Assistant:

static auto millisToWithinRange(qint64 millis)
{
    struct R {
        qint64 shifted = 0;
        bool good = false;
    } result;
    qint64 jd = msecsToJulianDay(millis);
    auto ymd = QGregorianCalendar::partsFromJulian(jd);
    const auto fakeJd = QGregorianCalendar::julianFromParts(systemTimeYearMatching(ymd.year),
                                                            ymd.month, ymd.day);
    result.good = fakeJd && !daysAndMillisOverflow(*fakeJd - jd, millis, &result.shifted);
    return result;
}